

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::Positional<std::tuple<double,_double>,_DoublesReader>::ParseValue
          (Positional<std::tuple<double,_double>,_DoublesReader> *this,string *value_)

{
  DoublesReader::operator()
            ((DoublesReader *)&this->field_0xc0,&(this->super_PositionalBase).super_NamedBase.name,
             value_,&this->value);
  (this->super_PositionalBase).super_NamedBase.field_0x99 = 0;
  (this->super_PositionalBase).super_NamedBase.super_Base.matched = true;
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
                ready = false;
                matched = true;
            }